

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O2

void Js::JavascriptExceptionObject::Remove(Type *head,JavascriptExceptionObject *item)

{
  JavascriptExceptionObject *pJVar1;
  code *pcVar2;
  bool bVar3;
  Type *this;
  undefined4 *puVar4;
  
  do {
    this = head;
    pJVar1 = this->ptr;
    if (pJVar1 == (JavascriptExceptionObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionObject.cpp"
                                  ,0xfe,"(false)","false");
      if (bVar3) {
        *puVar4 = 0;
        return;
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    head = &pJVar1->next;
  } while (pJVar1 != item);
  Memory::WriteBarrierPtr<Js::JavascriptExceptionObject>::operator=(this,&item->next);
  (item->next).ptr = (JavascriptExceptionObject *)0x0;
  return;
}

Assistant:

void JavascriptExceptionObject::Remove(
        Field(JavascriptExceptionObject*)* head, JavascriptExceptionObject* item)
    {
        // Typically Insert/Remove happens in reversed order and item should be
        // the front one. Loop the whole list to prevent unexpected order messup.
        for (auto p = head; *p; p = &(*p)->next)
        {
            if (*p == item)
            {
                *p = item->next;
                item->next = nullptr;
                return;
            }
        }

        Assert(false);  // item not in list unexpected
    }